

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,SiPair *row,uint skip)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  uint32_t i;
  uint uVar2;
  StringPtr *pSVar3;
  uint uVar4;
  long lVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  char **ppcVar7;
  uint uVar8;
  ArrayDisposer *pAVar9;
  char **ppcVar10;
  Maybe<unsigned_long> MVar11;
  bool local_71;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_70;
  size_t pos_local;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip != 1) {
    local_70 = table + 1;
    pSVar3 = (table->rows).builder.ptr;
    lVar5 = ((long)(table->rows).builder.pos - (long)pSVar3) / 0x18;
    i = row->i;
    pos_local = pos;
    if ((ulong)((long)table[1].rows.builder.disposer * 2) <
        ((long)&((table[1].rows.builder.pos)->content).ptr + lVar5) * 3 + 3U) {
      HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>::rehash
                ((HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher> *)local_70,lVar5 * 3 + 3)
      ;
    }
    uVar4 = _::intHash32(i);
    aVar6 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            table[1].rows.builder.disposer;
    uVar8 = (int)aVar6.value - 1U & uVar4;
    ppcVar7 = (char **)0x0;
LAB_00153f4a:
    ppcVar10 = &((table[1].rows.builder.endPtr)->content).ptr + uVar8;
    uVar2 = *(uint *)((long)ppcVar10 + 4);
    if (uVar2 == 1) {
      if (ppcVar7 == (char **)0x0) {
        ppcVar7 = ppcVar10;
      }
    }
    else {
      if (uVar2 == 0) {
        if (ppcVar7 != (char **)0x0) {
          ppRVar1 = &table[1].rows.builder.pos;
          *ppRVar1 = (RemoveConst<kj::StringPtr> *)((long)&(*ppRVar1)[-1].content.size_ + 7);
          ppcVar10 = ppcVar7;
        }
        *ppcVar10 = (char *)(((ulong)uVar4 | pos << 0x20) + 0x200000000);
        local_60.maybeFunc.ptr.isSet = true;
        local_60.maybeFunc.ptr.field_1.value.success = &local_71;
        local_60.maybeFunc.ptr.field_1.value.indexObj =
             (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)local_70;
        local_60.maybeFunc.ptr.field_1.value.pos = &pos_local;
        *this = (Impl<1UL,_false>)0x0;
        local_71 = true;
        local_60.maybeFunc.ptr.field_1.value.table = table;
        local_60.maybeFunc.ptr.field_1.value.row = &row->str;
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
        ::~Deferred(&local_60);
        aVar6 = extraout_RDX;
        goto LAB_00153fec;
      }
      if ((*(uint *)ppcVar10 == uVar4) &&
         (*(uint32_t *)((long)pSVar3 + (ulong)(uVar2 - 2) * 0x18 + 0x10) == i)) goto LAB_00153fe5;
    }
    pAVar9 = (ArrayDisposer *)((ulong)uVar8 + 1);
    uVar8 = (uint)pAVar9;
    if (pAVar9 == (ArrayDisposer *)aVar6.value) {
      uVar8 = 0;
    }
    goto LAB_00153f4a;
  }
  *this = (Impl<1UL,_false>)0x0;
  aVar6 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
LAB_00153fec:
  MVar11.ptr.field_1.value = aVar6.value;
  MVar11.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar11.ptr;
LAB_00153fe5:
  *this = (Impl<1UL,_false>)0x1;
  *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
  goto LAB_00153fec;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }